

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O1

int raptor_asprintf(char **strp,char *format,...)

{
  char *pcVar1;
  char in_AL;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong size;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char buf [128];
  undefined8 local_188;
  void **local_180;
  char *local_178;
  char local_168 [144];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  pcVar1 = local_168 + 0x80;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_180 = &args[0].overflow_arg_area;
  local_188 = 0x3000000010;
  local_168[0x70] = '\0';
  local_168[0x71] = '\0';
  local_168[0x72] = '\0';
  local_168[0x73] = '\0';
  local_168[0x74] = '\0';
  local_168[0x75] = '\0';
  local_168[0x76] = '\0';
  local_168[0x77] = '\0';
  local_168[0x78] = '\0';
  local_168[0x79] = '\0';
  local_168[0x7a] = '\0';
  local_168[0x7b] = '\0';
  local_168[0x7c] = '\0';
  local_168[0x7d] = '\0';
  local_168[0x7e] = '\0';
  local_168[0x7f] = '\0';
  local_168[0x60] = '\0';
  local_168[0x61] = '\0';
  local_168[0x62] = '\0';
  local_168[99] = '\0';
  local_168[100] = '\0';
  local_168[0x65] = '\0';
  local_168[0x66] = '\0';
  local_168[0x67] = '\0';
  local_168[0x68] = '\0';
  local_168[0x69] = '\0';
  local_168[0x6a] = '\0';
  local_168[0x6b] = '\0';
  local_168[0x6c] = '\0';
  local_168[0x6d] = '\0';
  local_168[0x6e] = '\0';
  local_168[0x6f] = '\0';
  local_168[0x50] = '\0';
  local_168[0x51] = '\0';
  local_168[0x52] = '\0';
  local_168[0x53] = '\0';
  local_168[0x54] = '\0';
  local_168[0x55] = '\0';
  local_168[0x56] = '\0';
  local_168[0x57] = '\0';
  local_168[0x58] = '\0';
  local_168[0x59] = '\0';
  local_168[0x5a] = '\0';
  local_168[0x5b] = '\0';
  local_168[0x5c] = '\0';
  local_168[0x5d] = '\0';
  local_168[0x5e] = '\0';
  local_168[0x5f] = '\0';
  local_168[0x40] = '\0';
  local_168[0x41] = '\0';
  local_168[0x42] = '\0';
  local_168[0x43] = '\0';
  local_168[0x44] = '\0';
  local_168[0x45] = '\0';
  local_168[0x46] = '\0';
  local_168[0x47] = '\0';
  local_168[0x48] = '\0';
  local_168[0x49] = '\0';
  local_168[0x4a] = '\0';
  local_168[0x4b] = '\0';
  local_168[0x4c] = '\0';
  local_168[0x4d] = '\0';
  local_168[0x4e] = '\0';
  local_168[0x4f] = '\0';
  local_168[0x30] = '\0';
  local_168[0x31] = '\0';
  local_168[0x32] = '\0';
  local_168[0x33] = '\0';
  local_168[0x34] = '\0';
  local_168[0x35] = '\0';
  local_168[0x36] = '\0';
  local_168[0x37] = '\0';
  local_168[0x38] = '\0';
  local_168[0x39] = '\0';
  local_168[0x3a] = '\0';
  local_168[0x3b] = '\0';
  local_168[0x3c] = '\0';
  local_168[0x3d] = '\0';
  local_168[0x3e] = '\0';
  local_168[0x3f] = '\0';
  local_168[0x20] = '\0';
  local_168[0x21] = '\0';
  local_168[0x22] = '\0';
  local_168[0x23] = '\0';
  local_168[0x24] = '\0';
  local_168[0x25] = '\0';
  local_168[0x26] = '\0';
  local_168[0x27] = '\0';
  local_168[0x28] = '\0';
  local_168[0x29] = '\0';
  local_168[0x2a] = '\0';
  local_168[0x2b] = '\0';
  local_168[0x2c] = '\0';
  local_168[0x2d] = '\0';
  local_168[0x2e] = '\0';
  local_168[0x2f] = '\0';
  local_168[0x10] = '\0';
  local_168[0x11] = '\0';
  local_168[0x12] = '\0';
  local_168[0x13] = '\0';
  local_168[0x14] = '\0';
  local_168[0x15] = '\0';
  local_168[0x16] = '\0';
  local_168[0x17] = '\0';
  local_168[0x18] = '\0';
  local_168[0x19] = '\0';
  local_168[0x1a] = '\0';
  local_168[0x1b] = '\0';
  local_168[0x1c] = '\0';
  local_168[0x1d] = '\0';
  local_168[0x1e] = '\0';
  local_168[0x1f] = '\0';
  local_168[0] = '\0';
  local_168[1] = '\0';
  local_168[2] = '\0';
  local_168[3] = '\0';
  local_168[4] = '\0';
  local_168[5] = '\0';
  local_168[6] = '\0';
  local_168[7] = '\0';
  local_168[8] = '\0';
  local_168[9] = '\0';
  local_168[10] = '\0';
  local_168[0xb] = '\0';
  local_168[0xc] = '\0';
  local_168[0xd] = '\0';
  local_168[0xe] = '\0';
  local_168[0xf] = '\0';
  local_178 = pcVar1;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  uVar2 = vsnprintf(local_168,0x80,format,&local_188);
  if (-1 < (int)uVar2) {
    size = (ulong)(uVar2 + 1);
    pcVar4 = (char *)raptor::Malloc(size);
    *strp = pcVar4;
    if (pcVar4 == (char *)0x0) {
      return -1;
    }
    local_180 = &args[0].overflow_arg_area;
    local_188 = 0x3000000010;
    if (uVar2 < 0x80) {
      local_178 = pcVar1;
      memcpy(*strp,local_168,size);
      return uVar2;
    }
    local_178 = pcVar1;
    uVar3 = vsnprintf(*strp,size,format,&local_188);
    if (uVar3 == uVar2) {
      return uVar3;
    }
    raptor::Free(*strp);
  }
  *strp = (char *)0x0;
  return -1;
}

Assistant:

int raptor_asprintf(char** strp, const char* format, ...) {
    va_list args;
    va_start(args, format);
#ifdef _WIN32
    int ret = _vscprintf(format, args);
#else
    char buf[128] = { 0 };
    int ret = vsnprintf(buf, sizeof(buf), format, args);
#endif
    va_end(args);
    if (ret < 0) {
        *strp = nullptr;
        return -1;
    }

    size_t strp_buflen = static_cast<size_t>(ret) + 1;
    if ((*strp = static_cast<char*>(raptor::Malloc(strp_buflen))) == nullptr) {
        return -1;
    }

    // try again using the larger buffer.
    va_start(args, format);
#ifdef _WIN32
    ret = vsnprintf_s(*strp, strp_buflen, _TRUNCATE, format, args);
#else
    if (strp_buflen <= sizeof(buf)) {
        memcpy(*strp, buf, strp_buflen);
        return ret;
    }
    ret = vsnprintf(*strp, strp_buflen, format, args);
#endif
    va_end(args);
    if (static_cast<size_t>(ret) == strp_buflen - 1) {
        return ret;
    }

    // this should never happen.
    raptor::Free(*strp);
    *strp = nullptr;
    return -1;
}